

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::Render(void)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  ImGuiContextHook *pIVar6;
  ImGuiViewportP *pIVar7;
  ImGuiWindow *window;
  ImVec2 IVar8;
  ImGuiContext *pIVar9;
  ImGuiContext *pIVar10;
  ImDrawList *pIVar11;
  ImDrawList **ppIVar12;
  ImGuiContext *g;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int n;
  long lVar16;
  ImGuiWindow *pIVar17;
  long lVar18;
  ImGuiWindow *pIVar19;
  ImGuiWindow *windows_to_render_top_most [2];
  ImGuiWindow *local_48 [3];
  
  pIVar9 = GImGui;
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    EndFrame();
  }
  pIVar9->FrameCountRendered = pIVar9->FrameCount;
  (pIVar9->IO).MetricsRenderWindows = 0;
  if (0 < (pIVar9->Hooks).Size) {
    lVar16 = 0;
    lVar18 = 0;
    do {
      pIVar6 = (pIVar9->Hooks).Data;
      if (*(int *)(pIVar6 + lVar16 + 4) == 4) {
        (**(code **)(pIVar6 + lVar16 + 0x10))(pIVar9);
      }
      lVar18 = lVar18 + 1;
      lVar16 = lVar16 + 0x20;
    } while (lVar18 < (pIVar9->Hooks).Size);
  }
  if ((pIVar9->Viewports).Size != 0) {
    uVar13 = 0;
    do {
      pIVar7 = (pIVar9->Viewports).Data[uVar13];
      ImDrawDataBuilder::Clear(&pIVar7->DrawDataBuilder);
      if (pIVar7->DrawLists[0] != (ImDrawList *)0x0) {
        pIVar11 = GetViewportDrawList(pIVar7,0,"##Background");
        AddDrawListToDrawData((pIVar7->DrawDataBuilder).Layers,pIVar11);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uint)(pIVar9->Viewports).Size);
  }
  pIVar19 = pIVar9->NavWindowingTarget;
  if ((pIVar19 == (ImGuiWindow *)0x0) || ((pIVar19->Flags & 0x2000) != 0)) {
    pIVar17 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar17 = pIVar19->RootWindow;
  }
  local_48[0] = pIVar17;
  if (pIVar19 == (ImGuiWindow *)0x0) {
    pIVar19 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar19 = pIVar9->NavWindowingListWindow;
  }
  local_48[1] = pIVar19;
  if ((pIVar9->Windows).Size != 0) {
    uVar13 = 0;
    do {
      window = (pIVar9->Windows).Data[uVar13];
      if ((window->Active == true) && (window->Hidden == false)) {
        if ((window != pIVar19 && window != pIVar17) && (window->Flags & 0x1000000U) == 0) {
          AddWindowToDrawData(window,(uint)window->Flags >> 0x19 & 1);
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uint)(pIVar9->Windows).Size);
  }
  lVar16 = 0;
  do {
    pIVar19 = local_48[lVar16];
    if (((pIVar19 != (ImGuiWindow *)0x0) && (pIVar19->Active == true)) && (pIVar19->Hidden == false)
       ) {
      AddWindowToDrawData(pIVar19,(uint)pIVar19->Flags >> 0x19 & 1);
    }
    lVar16 = lVar16 + 1;
  } while (lVar16 == 1);
  (pIVar9->IO).MetricsRenderVertices = 0;
  (pIVar9->IO).MetricsRenderIndices = 0;
  if (0 < (pIVar9->Viewports).Size) {
    lVar16 = 0;
    do {
      pIVar7 = (pIVar9->Viewports).Data[lVar16];
      ImDrawDataBuilder::FlattenIntoSingleLayer(&pIVar7->DrawDataBuilder);
      if ((pIVar9->IO).MouseDrawCursor == true) {
        pIVar11 = GetViewportDrawList(pIVar7,1,"##Foreground");
        RenderMouseCursor(pIVar11,(pIVar9->IO).MousePos,(pIVar9->Style).MouseCursorScale,
                          pIVar9->MouseCursor,0xffffffff,0xff000000,0x30000000);
      }
      if (pIVar7->DrawLists[1] != (ImDrawList *)0x0) {
        pIVar11 = GetViewportDrawList(pIVar7,1,"##Foreground");
        AddDrawListToDrawData((pIVar7->DrawDataBuilder).Layers,pIVar11);
      }
      pIVar10 = GImGui;
      (pIVar7->DrawDataP).Valid = true;
      iVar5 = (pIVar7->DrawDataBuilder).Layers[0].Size;
      if ((long)iVar5 < 1) {
        ppIVar12 = (ImDrawList **)0x0;
      }
      else {
        ppIVar12 = (pIVar7->DrawDataBuilder).Layers[0].Data;
      }
      (pIVar7->DrawDataP).CmdLists = ppIVar12;
      (pIVar7->DrawDataP).CmdListsCount = iVar5;
      (pIVar7->DrawDataP).TotalIdxCount = 0;
      (pIVar7->DrawDataP).TotalVtxCount = 0;
      IVar8 = (pIVar7->super_ImGuiViewport).Size;
      (pIVar7->DrawDataP).DisplayPos = (pIVar7->super_ImGuiViewport).Pos;
      (pIVar7->DrawDataP).DisplaySize = IVar8;
      (pIVar7->DrawDataP).FramebufferScale = (pIVar10->IO).DisplayFramebufferScale;
      if (0 < iVar5) {
        lVar18 = 0;
        iVar14 = 0;
        iVar15 = 0;
        do {
          pIVar11 = (pIVar7->DrawDataBuilder).Layers[0].Data[lVar18];
          iVar15 = iVar15 + (pIVar11->VtxBuffer).Size;
          iVar14 = iVar14 + (pIVar11->IdxBuffer).Size;
          lVar18 = lVar18 + 1;
        } while (iVar5 != lVar18);
        (pIVar7->DrawDataP).TotalVtxCount = iVar15;
        (pIVar7->DrawDataP).TotalIdxCount = iVar14;
      }
      uVar1 = (pIVar7->DrawDataP).TotalIdxCount;
      uVar3 = (pIVar7->DrawDataP).TotalVtxCount;
      uVar2 = (pIVar9->IO).MetricsRenderVertices;
      uVar4 = (pIVar9->IO).MetricsRenderIndices;
      (pIVar9->IO).MetricsRenderVertices = uVar2 + uVar3;
      (pIVar9->IO).MetricsRenderIndices = uVar4 + uVar1;
      lVar16 = lVar16 + 1;
    } while (lVar16 < (pIVar9->Viewports).Size);
  }
  if (0 < (pIVar9->Hooks).Size) {
    lVar16 = 0;
    lVar18 = 0;
    do {
      pIVar6 = (pIVar9->Hooks).Data;
      if (*(int *)(pIVar6 + lVar16 + 4) == 5) {
        (**(code **)(pIVar6 + lVar16 + 0x10))(pIVar9,pIVar6 + lVar16);
      }
      lVar18 = lVar18 + 1;
      lVar16 = lVar16 + 0x20;
    } while (lVar18 < (pIVar9->Hooks).Size);
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;

    CallContextHooks(&g, ImGuiContextHookType_RenderPre);

    // Add background ImDrawList (for each active viewport)
    for (int n = 0; n != g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.Clear();
        if (viewport->DrawLists[0] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetBackgroundDrawList(viewport));
    }

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);

    // Setup ImDrawData structures for end-user
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = 0;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.FlattenIntoSingleLayer();

        // Draw software mouse cursor if requested by io.MouseDrawCursor flag
        if (g.IO.MouseDrawCursor)
            RenderMouseCursor(GetForegroundDrawList(viewport), g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

        // Add foreground ImDrawList (for each active viewport)
        if (viewport->DrawLists[1] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetForegroundDrawList(viewport));

        SetupViewportDrawData(viewport, &viewport->DrawDataBuilder.Layers[0]);
        ImDrawData* draw_data = &viewport->DrawDataP;
        g.IO.MetricsRenderVertices += draw_data->TotalVtxCount;
        g.IO.MetricsRenderIndices += draw_data->TotalIdxCount;
    }

    CallContextHooks(&g, ImGuiContextHookType_RenderPost);
}